

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O1

int KINSetFuncNormTol(void *kinmem,realtype fnormtol)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar1 = -1;
    error_code = -1;
  }
  else {
    if (0.0 <= fnormtol) {
      if ((fnormtol == 0.0) && (!NAN(fnormtol))) {
        fnormtol = SUNRpowerR(*kinmem,0.3333333333333333);
      }
      *(realtype *)((long)kinmem + 0x18) = fnormtol;
      return 0;
    }
    msgfmt = "fnormtol < 0 illegal.";
    iVar1 = -2;
    error_code = -2;
  }
  KINProcessError((KINMem)0x0,error_code,"KINSOL","KINSetFuncNormTol",msgfmt);
  return iVar1;
}

Assistant:

int KINSetFuncNormTol(void *kinmem, realtype fnormtol)
{
  KINMem kin_mem;
  realtype uround;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetFuncNormTol", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  if (fnormtol < ZERO) {
    KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetFuncNormTol", MSG_BAD_FNORMTOL);
    return(KIN_ILL_INPUT);
  }

  if (fnormtol == ZERO) {
    uround = kin_mem->kin_uround;
    kin_mem->kin_fnormtol = SUNRpowerR(uround,ONETHIRD);
  } else {
    kin_mem->kin_fnormtol = fnormtol;
  }

  return(KIN_SUCCESS);
}